

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-socket-buffer-size.c
# Opt level: O0

void check_buffer_size(uv_handle_t *handle)

{
  int iVar1;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_handle_t *puStack_18;
  int value;
  uv_handle_t *handle_local;
  
  eval_a._4_4_ = 0;
  puStack_18 = handle;
  iVar1 = uv_recv_buffer_size(handle,(int *)((long)&eval_a + 4));
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-socket-buffer-size.c"
            ,0x2b,"uv_recv_buffer_size(handle, &value)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)eval_a._4_4_ < 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-socket-buffer-size.c"
            ,0x2c,"value",">","0",(long)eval_a._4_4_,">",0);
    abort();
  }
  eval_a._4_4_ = 10000;
  iVar1 = uv_recv_buffer_size(puStack_18,(int *)((long)&eval_a + 4));
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-socket-buffer-size.c"
            ,0x2f,"uv_recv_buffer_size(handle, &value)","==","0",(long)iVar1,"==",0);
    abort();
  }
  eval_a._4_4_ = 0;
  iVar1 = uv_recv_buffer_size(puStack_18,(int *)((long)&eval_a + 4));
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-socket-buffer-size.c"
            ,0x32,"uv_recv_buffer_size(handle, &value)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((eval_a._4_4_ != 10000) && (eval_a._4_4_ != 20000)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-socket-buffer-size.c"
            ,0x34,"value == 10000 || value == 20000");
    abort();
  }
  return;
}

Assistant:

static void check_buffer_size(uv_handle_t* handle) {
  int value;

  value = 0;
  ASSERT_OK(uv_recv_buffer_size(handle, &value));
  ASSERT_GT(value, 0);

  value = 10000;
  ASSERT_OK(uv_recv_buffer_size(handle, &value));

  value = 0;
  ASSERT_OK(uv_recv_buffer_size(handle, &value));
  /* linux sets double the value */
  ASSERT(value == 10000 || value == 20000);
}